

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDebuggerAdapterPipe.cxx
# Opt level: O0

bool testProtocolWithPipes(void)

{
  bool bVar1;
  future_status fVar2;
  pointer pSVar3;
  ostream *poVar4;
  element_type *this;
  CMakeInitializeRequest *request;
  int64_t iVar5;
  LaunchRequest *request_00;
  ConfigurationDoneRequest *request_01;
  DisconnectRequest *request_02;
  bool local_649;
  future<dap::ResponseOrError<dap::DisconnectResponse>_> local_648;
  undefined1 local_638 [8];
  ResponseOrError<dap::DisconnectResponse> disconnectResponse;
  undefined1 local_608 [2];
  DisconnectRequest disconnectRequest;
  undefined1 local_5f8 [8];
  ResponseOrError<dap::ConfigurationDoneResponse> configurationDoneResponse;
  undefined1 local_5c8 [7];
  ConfigurationDoneRequest configurationDoneRequest;
  undefined1 local_5b8 [8];
  ResponseOrError<dap::LaunchResponse> launchResponse;
  LaunchRequest launchRequest;
  ResponseOrError<dap::CMakeInitializeResponse> initializeResponse;
  future<dap::ResponseOrError<dap::CMakeInitializeResponse>_> response;
  CMakeInitializeRequest initializeRequest;
  sockaddr local_240;
  shared_ptr<dap::Reader> local_230;
  undefined1 local_220 [8];
  shared_ptr<cmDebugger::cmDebuggerPipeClient_POSIX> client2Debugger;
  type local_208;
  ScopedThread local_1d8;
  ScopedThread debuggerThread;
  anon_class_8_1_6c0b4d01_for_handler local_1c0;
  anon_class_8_1_c4060b9b_for_handler local_1b8;
  anon_class_8_1_2d759ed4_for_handler local_1b0;
  unique_ptr<dap::Session,_std::default_delete<dap::Session>_> local_1a8;
  unique_ptr<dap::Session,_std::default_delete<dap::Session>_> client;
  undefined1 local_198 [8];
  string namedPipe;
  seconds futureTimeout;
  future<bool> disconnectResponseReceivedFuture;
  promise<bool> disconnectResponseReceivedPromise;
  future<bool> threadExitedFuture;
  promise<bool> threadExitedPromise;
  future<bool> threadStartedFuture;
  promise<bool> threadStartedPromise;
  future<bool> terminatedEventReceivedFuture;
  promise<bool> terminatedEventReceivedPromise;
  future<bool> exitedEventReceivedFuture;
  promise<bool> exitedEventReceivedPromise;
  future<bool> initializedEventReceivedFuture;
  promise<bool> initializedEventReceivedPromise;
  future<bool> debuggerAdapterInitializedFuture;
  promise<bool> debuggerAdapterInitializedPromise;
  future<void> startedListeningFuture;
  future<void> debuggerConnectionCreatedFuture;
  promise<void> debuggerConnectionCreatedPromise;
  
  std::promise<void>::promise
            ((promise<void> *)
             &debuggerConnectionCreatedFuture.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::promise<void>::get_future((promise<void> *)&stack0xffffffffffffffc8);
  std::future<void>::future((future<void> *)&debuggerAdapterInitializedPromise._M_storage);
  std::promise<bool>::promise
            ((promise<bool> *)
             &debuggerAdapterInitializedFuture.super___basic_future<bool>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::promise<bool>::get_future((promise<bool> *)&initializedEventReceivedPromise._M_storage);
  std::promise<bool>::promise
            ((promise<bool> *)
             &initializedEventReceivedFuture.super___basic_future<bool>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::promise<bool>::get_future((promise<bool> *)&exitedEventReceivedPromise._M_storage);
  std::promise<bool>::promise
            ((promise<bool> *)
             &exitedEventReceivedFuture.super___basic_future<bool>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::promise<bool>::get_future((promise<bool> *)&terminatedEventReceivedPromise._M_storage);
  std::promise<bool>::promise
            ((promise<bool> *)
             &terminatedEventReceivedFuture.super___basic_future<bool>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::promise<bool>::get_future((promise<bool> *)&threadStartedPromise._M_storage);
  std::promise<bool>::promise
            ((promise<bool> *)
             &threadStartedFuture.super___basic_future<bool>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::promise<bool>::get_future((promise<bool> *)&threadExitedPromise._M_storage);
  std::promise<bool>::promise
            ((promise<bool> *)
             &threadExitedFuture.super___basic_future<bool>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::promise<bool>::get_future((promise<bool> *)&disconnectResponseReceivedPromise._M_storage);
  std::promise<bool>::promise
            ((promise<bool> *)
             &disconnectResponseReceivedFuture.super___basic_future<bool>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::promise<bool>::get_future((promise<bool> *)&futureTimeout);
  namedPipe.field_2._8_8_ = 0x3c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_198,"CMakeDebuggerPipe2",
             (allocator<char> *)
             ((long)&client._M_t.
                     super___uniq_ptr_impl<dap::Session,_std::default_delete<dap::Session>_>._M_t.
                     super__Tuple_impl<0UL,_dap::Session_*,_std::default_delete<dap::Session>_>.
                     super__Head_base<0UL,_dap::Session_*,_false>._M_head_impl + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&client._M_t.
                     super___uniq_ptr_impl<dap::Session,_std::default_delete<dap::Session>_>._M_t.
                     super__Tuple_impl<0UL,_dap::Session_*,_std::default_delete<dap::Session>_>.
                     super__Head_base<0UL,_dap::Session_*,_false>._M_head_impl + 7));
  dap::Session::create();
  pSVar3 = std::unique_ptr<dap::Session,_std::default_delete<dap::Session>_>::operator->(&local_1a8)
  ;
  local_1b0.initializedEventReceivedPromise =
       (promise<bool> *)
       &initializedEventReceivedFuture.super___basic_future<bool>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount;
  dap::Session::registerHandler<testProtocolWithPipes()::__0,dap::InitializedEvent>
            (pSVar3,&local_1b0);
  pSVar3 = std::unique_ptr<dap::Session,_std::default_delete<dap::Session>_>::operator->(&local_1a8)
  ;
  local_1b8.exitedEventReceivedPromise =
       (promise<bool> *)
       &exitedEventReceivedFuture.super___basic_future<bool>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount;
  dap::Session::registerHandler<testProtocolWithPipes()::__1,dap::ExitedEvent>(pSVar3,&local_1b8);
  pSVar3 = std::unique_ptr<dap::Session,_std::default_delete<dap::Session>_>::operator->(&local_1a8)
  ;
  local_1c0.terminatedEventReceivedPromise =
       (promise<bool> *)
       &terminatedEventReceivedFuture.super___basic_future<bool>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount;
  dap::Session::registerHandler<testProtocolWithPipes()::__2,dap::TerminatedEvent>
            (pSVar3,&local_1c0);
  pSVar3 = std::unique_ptr<dap::Session,_std::default_delete<dap::Session>_>::operator->(&local_1a8)
  ;
  debuggerThread.Thread._M_id._M_thread =
       (thread)&threadStartedFuture.super___basic_future<bool>._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
  dap::Session::registerHandler<testProtocolWithPipes()::__3,dap::ThreadEvent>
            (pSVar3,(anon_class_16_2_0c1c36bb_for_handler *)&debuggerThread);
  local_208.namedPipe = (string *)local_198;
  local_208.startedListeningFuture = (future<void> *)&debuggerAdapterInitializedPromise._M_storage;
  local_208.debuggerConnectionCreatedPromise =
       (promise<void> *)
       &debuggerConnectionCreatedFuture.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount;
  local_208.debuggerAdapterInitializedPromise =
       (promise<bool> *)
       &debuggerAdapterInitializedFuture.super___basic_future<bool>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount;
  local_208.disconnectResponseReceivedFuture = (future<bool> *)&futureTimeout;
  local_208.futureTimeout = (seconds *)((long)&namedPipe.field_2 + 8);
  ScopedThread::ScopedThread<testProtocolWithPipes()::__4>(&local_1d8,&local_208);
  fVar2 = std::__basic_future<void>::wait_for<long,std::ratio<1l,1l>>
                    ((__basic_future<void> *)&stack0xffffffffffffffc8,
                     (duration<long,_std::ratio<1L,_1L>_> *)((long)&namedPipe.field_2 + 8));
  if (fVar2 == ready) {
    fVar2 = std::__basic_future<void>::wait_for<long,std::ratio<1l,1l>>
                      ((__basic_future<void> *)&debuggerAdapterInitializedPromise._M_storage,
                       (duration<long,_std::ratio<1L,_1L>_> *)((long)&namedPipe.field_2 + 8));
    if (fVar2 == ready) {
      std::make_shared<cmDebugger::cmDebuggerPipeClient_POSIX,std::__cxx11::string&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220);
      this = std::
             __shared_ptr_access<cmDebugger::cmDebuggerPipeClient_POSIX,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cmDebugger::cmDebuggerPipeClient_POSIX,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_220);
      cmDebugger::cmDebuggerPipeClient_POSIX::WaitForConnection(this);
      pSVar3 = std::unique_ptr<dap::Session,_std::default_delete<dap::Session>_>::operator->
                         (&local_1a8);
      std::shared_ptr<dap::Reader>::shared_ptr<cmDebugger::cmDebuggerPipeClient_POSIX,void>
                (&local_230,(shared_ptr<cmDebugger::cmDebuggerPipeClient_POSIX> *)local_220);
      std::shared_ptr<dap::Writer>::shared_ptr<cmDebugger::cmDebuggerPipeClient_POSIX,void>
                ((shared_ptr<dap::Writer> *)&local_240,
                 (shared_ptr<cmDebugger::cmDebuggerPipeClient_POSIX> *)local_220);
      std::function<void_()>::function((function<void_()> *)&initializeRequest.supportsVariableType)
      ;
      dap::Session::bind(pSVar3,(int)&local_230,&local_240,
                         (socklen_t)&initializeRequest.supportsVariableType);
      std::function<void_()>::~function
                ((function<void_()> *)&initializeRequest.supportsVariableType);
      std::shared_ptr<dap::Writer>::~shared_ptr((shared_ptr<dap::Writer> *)&local_240);
      std::shared_ptr<dap::Reader>::~shared_ptr(&local_230);
      dap::CMakeInitializeRequest::CMakeInitializeRequest
                ((CMakeInitializeRequest *)
                 &response.state.
                  super___shared_ptr<dap::detail::promise_state<dap::ResponseOrError<dap::CMakeInitializeResponse>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      request = (CMakeInitializeRequest *)
                std::unique_ptr<dap::Session,_std::default_delete<dap::Session>_>::operator->
                          (&local_1a8);
      dap::Session::send<dap::CMakeInitializeRequest,void>
                ((Session *)((long)&initializeResponse.error.message.field_2 + 8),request);
      dap::future<dap::ResponseOrError<dap::CMakeInitializeResponse>_>::get
                ((ResponseOrError<dap::CMakeInitializeResponse> *)&launchRequest.noDebug,
                 (future<dap::ResponseOrError<dap::CMakeInitializeResponse>_> *)
                 ((long)&initializeResponse.error.message.field_2 + 8));
      bVar1 = dap::Error::operator_cast_to_bool
                        ((Error *)((long)&initializeResponse.response.cmakeVersion.full.field_2 + 8)
                        );
      if (bVar1) {
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "ASSERT_TRUE(!initializeResponse.error) failed on line ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x8c);
        std::operator<<(poVar4,"\n");
        debuggerConnectionCreatedPromise._M_storage._M_t.
        super___uniq_ptr_impl<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter>
        ._M_t.
        super__Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
        .super__Head_base<0UL,_std::__future_base::_Result<void>_*,_false>._M_head_impl._7_1_ =
             false;
        client2Debugger.
        super___shared_ptr<cmDebugger::cmDebuggerPipeClient_POSIX,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._4_4_ = 1;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&initializeResponse.response.cmakeVersion.patch,
                                "3.29.20240330-ge5f7ff8");
        if (bVar1) {
          iVar5 = dap::integer::operator_cast_to_long
                            ((integer *)
                             &initializeResponse.response.cmakeVersion.super_InitializeResponse.
                              supportsWriteMemoryRequest);
          if (iVar5 == 3) {
            iVar5 = dap::integer::operator_cast_to_long
                              (&initializeResponse.response.cmakeVersion.major);
            if (iVar5 == 0x1d) {
              iVar5 = dap::integer::operator_cast_to_long
                                (&initializeResponse.response.cmakeVersion.minor);
              if (iVar5 == 0x134d7ca) {
                bVar1 = dap::optional::operator_cast_to_bool
                                  ((optional *)
                                   &initializeResponse.response.supportsDelayedStackTraceLoading);
                if (bVar1) {
                  bVar1 = dap::
                          optional<std::vector<dap::ExceptionBreakpointsFilter,_std::allocator<dap::ExceptionBreakpointsFilter>_>_>
                          ::has_value((optional<std::vector<dap::ExceptionBreakpointsFilter,_std::allocator<dap::ExceptionBreakpointsFilter>_>_>
                                       *)&initializeResponse.response.completionTriggerCharacters.
                                          set);
                  if (bVar1) {
                    dap::LaunchRequest::LaunchRequest
                              ((LaunchRequest *)((long)&launchResponse.error.message.field_2 + 8));
                    request_00 = (LaunchRequest *)
                                 std::unique_ptr<dap::Session,_std::default_delete<dap::Session>_>::
                                 operator->(&local_1a8);
                    dap::Session::send<dap::LaunchRequest,void>((Session *)local_5c8,request_00);
                    dap::future<dap::ResponseOrError<dap::LaunchResponse>_>::get
                              ((ResponseOrError<dap::LaunchResponse> *)local_5b8,
                               (future<dap::ResponseOrError<dap::LaunchResponse>_> *)local_5c8);
                    dap::future<dap::ResponseOrError<dap::LaunchResponse>_>::~future
                              ((future<dap::ResponseOrError<dap::LaunchResponse>_> *)local_5c8);
                    bVar1 = dap::Error::operator_cast_to_bool((Error *)&launchResponse);
                    if (bVar1) {
                      poVar4 = std::operator<<((ostream *)&std::cout,
                                               "ASSERT_TRUE(!launchResponse.error) failed on line ")
                      ;
                      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x99);
                      std::operator<<(poVar4,"\n");
                      debuggerConnectionCreatedPromise._M_storage._M_t.
                      super___uniq_ptr_impl<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
                      .super__Head_base<0UL,_std::__future_base::_Result<void>_*,_false>.
                      _M_head_impl._7_1_ = false;
                      client2Debugger.
                      super___shared_ptr<cmDebugger::cmDebuggerPipeClient_POSIX,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi._4_4_ = 1;
                    }
                    else {
                      request_01 = (ConfigurationDoneRequest *)
                                   std::unique_ptr<dap::Session,_std::default_delete<dap::Session>_>
                                   ::operator->(&local_1a8);
                      dap::Session::send<dap::ConfigurationDoneRequest,void>
                                ((Session *)local_608,request_01);
                      dap::future<dap::ResponseOrError<dap::ConfigurationDoneResponse>_>::get
                                ((ResponseOrError<dap::ConfigurationDoneResponse> *)local_5f8,
                                 (future<dap::ResponseOrError<dap::ConfigurationDoneResponse>_> *)
                                 local_608);
                      dap::future<dap::ResponseOrError<dap::ConfigurationDoneResponse>_>::~future
                                ((future<dap::ResponseOrError<dap::ConfigurationDoneResponse>_> *)
                                 local_608);
                      bVar1 = dap::Error::operator_cast_to_bool((Error *)&configurationDoneResponse)
                      ;
                      if (bVar1) {
                        poVar4 = std::operator<<((ostream *)&std::cout,
                                                 "ASSERT_TRUE(!configurationDoneResponse.error) failed on line "
                                                );
                        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x9e);
                        std::operator<<(poVar4,"\n");
                        debuggerConnectionCreatedPromise._M_storage._M_t.
                        super___uniq_ptr_impl<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
                        .super__Head_base<0UL,_std::__future_base::_Result<void>_*,_false>.
                        _M_head_impl._7_1_ = false;
                        client2Debugger.
                        super___shared_ptr<cmDebugger::cmDebuggerPipeClient_POSIX,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi._4_4_ = 1;
                      }
                      else {
                        fVar2 = std::__basic_future<bool>::wait_for<long,std::ratio<1l,1l>>
                                          ((__basic_future<bool> *)
                                           &initializedEventReceivedPromise._M_storage,
                                           (duration<long,_std::ratio<1L,_1L>_> *)
                                           ((long)&namedPipe.field_2 + 8));
                        if (fVar2 == ready) {
                          fVar2 = std::__basic_future<bool>::wait_for<long,std::ratio<1l,1l>>
                                            ((__basic_future<bool> *)
                                             &exitedEventReceivedPromise._M_storage,
                                             (duration<long,_std::ratio<1L,_1L>_> *)
                                             ((long)&namedPipe.field_2 + 8));
                          if (fVar2 == ready) {
                            fVar2 = std::__basic_future<bool>::wait_for<long,std::ratio<1l,1l>>
                                              ((__basic_future<bool> *)
                                               &threadStartedPromise._M_storage,
                                               (duration<long,_std::ratio<1L,_1L>_> *)
                                               ((long)&namedPipe.field_2 + 8));
                            if (fVar2 == ready) {
                              fVar2 = std::__basic_future<bool>::wait_for<long,std::ratio<1l,1l>>
                                                ((__basic_future<bool> *)
                                                 &threadExitedPromise._M_storage,
                                                 (duration<long,_std::ratio<1L,_1L>_> *)
                                                 ((long)&namedPipe.field_2 + 8));
                              if (fVar2 == ready) {
                                fVar2 = std::__basic_future<bool>::wait_for<long,std::ratio<1l,1l>>
                                                  ((__basic_future<bool> *)
                                                   &disconnectResponseReceivedPromise._M_storage,
                                                   (duration<long,_std::ratio<1L,_1L>_> *)
                                                   ((long)&namedPipe.field_2 + 8));
                                if (fVar2 == ready) {
                                  fVar2 = std::__basic_future<bool>::
                                          wait_for<long,std::ratio<1l,1l>>
                                                    ((__basic_future<bool> *)
                                                     &terminatedEventReceivedPromise._M_storage,
                                                     (duration<long,_std::ratio<1L,_1L>_> *)
                                                     ((long)&namedPipe.field_2 + 8));
                                  if (fVar2 == ready) {
                                    dap::DisconnectRequest::DisconnectRequest
                                              ((DisconnectRequest *)
                                               ((long)&disconnectResponse.error.message.field_2 + 10
                                               ));
                                    request_02 = (DisconnectRequest *)
                                                 std::
                                                 unique_ptr<dap::Session,_std::default_delete<dap::Session>_>
                                                 ::operator->(&local_1a8);
                                    dap::Session::send<dap::DisconnectRequest,void>
                                              ((Session *)&local_648,request_02);
                                    dap::future<dap::ResponseOrError<dap::DisconnectResponse>_>::get
                                              ((ResponseOrError<dap::DisconnectResponse> *)local_638
                                               ,&local_648);
                                    dap::future<dap::ResponseOrError<dap::DisconnectResponse>_>::
                                    ~future(&local_648);
                                    local_649 = true;
                                    std::promise<bool>::set_value
                                              ((promise<bool> *)
                                               &disconnectResponseReceivedFuture.
                                                super___basic_future<bool>._M_state.
                                                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount,&local_649);
                                    bVar1 = dap::Error::operator_cast_to_bool
                                                      ((Error *)&disconnectResponse);
                                    if (bVar1) {
                                      poVar4 = std::operator<<((ostream *)&std::cout,
                                                                                                                              
                                                  "ASSERT_TRUE(!disconnectResponse.error) failed on line "
                                                  );
                                      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xb0);
                                      std::operator<<(poVar4,"\n");
                                    }
                                    debuggerConnectionCreatedPromise._M_storage._M_t.
                                    super___uniq_ptr_impl<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
                                    .
                                    super__Head_base<0UL,_std::__future_base::_Result<void>_*,_false>
                                    ._M_head_impl._7_1_ = !bVar1;
                                    client2Debugger.
                                    super___shared_ptr<cmDebugger::cmDebuggerPipeClient_POSIX,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi._4_4_ = 1;
                                    dap::ResponseOrError<dap::DisconnectResponse>::~ResponseOrError
                                              ((ResponseOrError<dap::DisconnectResponse> *)local_638
                                              );
                                  }
                                  else {
                                    poVar4 = std::operator<<((ostream *)&std::cout,
                                                                                                                          
                                                  "ASSERT_TRUE(exitedEventReceivedFuture.wait_for(futureTimeout) == std::future_status::ready) failed on line "
                                                  );
                                    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xab);
                                    std::operator<<(poVar4,"\n");
                                    debuggerConnectionCreatedPromise._M_storage._M_t.
                                    super___uniq_ptr_impl<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
                                    .
                                    super__Head_base<0UL,_std::__future_base::_Result<void>_*,_false>
                                    ._M_head_impl._7_1_ = false;
                                    client2Debugger.
                                    super___shared_ptr<cmDebugger::cmDebuggerPipeClient_POSIX,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi._4_4_ = 1;
                                  }
                                }
                                else {
                                  poVar4 = std::operator<<((ostream *)&std::cout,
                                                                                                                      
                                                  "ASSERT_TRUE(threadExitedFuture.wait_for(futureTimeout) == std::future_status::ready) failed on line "
                                                  );
                                  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xa9);
                                  std::operator<<(poVar4,"\n");
                                  debuggerConnectionCreatedPromise._M_storage._M_t.
                                  super___uniq_ptr_impl<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
                                  .super__Head_base<0UL,_std::__future_base::_Result<void>_*,_false>
                                  ._M_head_impl._7_1_ = false;
                                  client2Debugger.
                                  super___shared_ptr<cmDebugger::cmDebuggerPipeClient_POSIX,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi._4_4_ = 1;
                                }
                              }
                              else {
                                poVar4 = std::operator<<((ostream *)&std::cout,
                                                                                                                  
                                                  "ASSERT_TRUE(threadStartedFuture.wait_for(futureTimeout) == std::future_status::ready) failed on line "
                                                  );
                                poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xa7);
                                std::operator<<(poVar4,"\n");
                                debuggerConnectionCreatedPromise._M_storage._M_t.
                                super___uniq_ptr_impl<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
                                .super__Head_base<0UL,_std::__future_base::_Result<void>_*,_false>.
                                _M_head_impl._7_1_ = false;
                                client2Debugger.
                                super___shared_ptr<cmDebugger::cmDebuggerPipeClient_POSIX,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi._4_4_ = 1;
                              }
                            }
                            else {
                              poVar4 = std::operator<<((ostream *)&std::cout,
                                                                                                              
                                                  "ASSERT_TRUE(terminatedEventReceivedFuture.wait_for(futureTimeout) == std::future_status::ready) failed on line "
                                                  );
                              poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xa5);
                              std::operator<<(poVar4,"\n");
                              debuggerConnectionCreatedPromise._M_storage._M_t.
                              super___uniq_ptr_impl<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
                              .super__Head_base<0UL,_std::__future_base::_Result<void>_*,_false>.
                              _M_head_impl._7_1_ = false;
                              client2Debugger.
                              super___shared_ptr<cmDebugger::cmDebuggerPipeClient_POSIX,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi._4_4_ = 1;
                            }
                          }
                          else {
                            poVar4 = std::operator<<((ostream *)&std::cout,
                                                                                                          
                                                  "ASSERT_TRUE(initializedEventReceivedFuture.wait_for(futureTimeout) == std::future_status::ready) failed on line "
                                                  );
                            poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xa3);
                            std::operator<<(poVar4,"\n");
                            debuggerConnectionCreatedPromise._M_storage._M_t.
                            super___uniq_ptr_impl<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
                            .super__Head_base<0UL,_std::__future_base::_Result<void>_*,_false>.
                            _M_head_impl._7_1_ = false;
                            client2Debugger.
                            super___shared_ptr<cmDebugger::cmDebuggerPipeClient_POSIX,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi._4_4_ = 1;
                          }
                        }
                        else {
                          poVar4 = std::operator<<((ostream *)&std::cout,
                                                                                                      
                                                  "ASSERT_TRUE(debuggerAdapterInitializedFuture.wait_for(futureTimeout) == std::future_status::ready) failed on line "
                                                  );
                          poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xa1);
                          std::operator<<(poVar4,"\n");
                          debuggerConnectionCreatedPromise._M_storage._M_t.
                          super___uniq_ptr_impl<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
                          .super__Head_base<0UL,_std::__future_base::_Result<void>_*,_false>.
                          _M_head_impl._7_1_ = false;
                          client2Debugger.
                          super___shared_ptr<cmDebugger::cmDebuggerPipeClient_POSIX,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi._4_4_ = 1;
                        }
                      }
                      dap::ResponseOrError<dap::ConfigurationDoneResponse>::~ResponseOrError
                                ((ResponseOrError<dap::ConfigurationDoneResponse> *)local_5f8);
                    }
                    dap::ResponseOrError<dap::LaunchResponse>::~ResponseOrError
                              ((ResponseOrError<dap::LaunchResponse> *)local_5b8);
                    dap::LaunchRequest::~LaunchRequest
                              ((LaunchRequest *)((long)&launchResponse.error.message.field_2 + 8));
                  }
                  else {
                    poVar4 = std::operator<<((ostream *)&std::cout,
                                             "ASSERT_TRUE(initializeResponse.response.exceptionBreakpointFilters.has_value()) failed on line "
                                            );
                    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x96);
                    std::operator<<(poVar4,"\n");
                    debuggerConnectionCreatedPromise._M_storage._M_t.
                    super___uniq_ptr_impl<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
                    .super__Head_base<0UL,_std::__future_base::_Result<void>_*,_false>._M_head_impl.
                    _7_1_ = false;
                    client2Debugger.
                    super___shared_ptr<cmDebugger::cmDebuggerPipeClient_POSIX,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi._4_4_ = 1;
                  }
                }
                else {
                  poVar4 = std::operator<<((ostream *)&std::cout,
                                           "ASSERT_TRUE(initializeResponse.response.supportsExceptionInfoRequest) failed on line "
                                          );
                  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x94);
                  std::operator<<(poVar4,"\n");
                  debuggerConnectionCreatedPromise._M_storage._M_t.
                  super___uniq_ptr_impl<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
                  .super__Head_base<0UL,_std::__future_base::_Result<void>_*,_false>._M_head_impl.
                  _7_1_ = false;
                  client2Debugger.
                  super___shared_ptr<cmDebugger::cmDebuggerPipeClient_POSIX,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi._4_4_ = 1;
                }
              }
              else {
                poVar4 = std::operator<<((ostream *)&std::cout,
                                         "ASSERT_TRUE(initializeResponse.response.cmakeVersion.patch == CMake_VERSION_PATCH) failed on line "
                                        );
                poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x93);
                std::operator<<(poVar4,"\n");
                debuggerConnectionCreatedPromise._M_storage._M_t.
                super___uniq_ptr_impl<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter>
                ._M_t.
                super__Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
                .super__Head_base<0UL,_std::__future_base::_Result<void>_*,_false>._M_head_impl.
                _7_1_ = false;
                client2Debugger.
                super___shared_ptr<cmDebugger::cmDebuggerPipeClient_POSIX,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi._4_4_ = 1;
              }
            }
            else {
              poVar4 = std::operator<<((ostream *)&std::cout,
                                       "ASSERT_TRUE(initializeResponse.response.cmakeVersion.minor == CMake_VERSION_MINOR) failed on line "
                                      );
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x91);
              std::operator<<(poVar4,"\n");
              debuggerConnectionCreatedPromise._M_storage._M_t.
              super___uniq_ptr_impl<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter>
              ._M_t.
              super__Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
              .super__Head_base<0UL,_std::__future_base::_Result<void>_*,_false>._M_head_impl._7_1_
                   = false;
              client2Debugger.
              super___shared_ptr<cmDebugger::cmDebuggerPipeClient_POSIX,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi._4_4_ = 1;
            }
          }
          else {
            poVar4 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(initializeResponse.response.cmakeVersion.major == CMake_VERSION_MAJOR) failed on line "
                                    );
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x8f);
            std::operator<<(poVar4,"\n");
            debuggerConnectionCreatedPromise._M_storage._M_t.
            super___uniq_ptr_impl<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter>
            ._M_t.
            super__Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
            .super__Head_base<0UL,_std::__future_base::_Result<void>_*,_false>._M_head_impl._7_1_ =
                 false;
            client2Debugger.
            super___shared_ptr<cmDebugger::cmDebuggerPipeClient_POSIX,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._4_4_ = 1;
          }
        }
        else {
          poVar4 = std::operator<<((ostream *)&std::cout,
                                   "ASSERT_TRUE(initializeResponse.response.cmakeVersion.full == CMake_VERSION) failed on line "
                                  );
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x8d);
          std::operator<<(poVar4,"\n");
          debuggerConnectionCreatedPromise._M_storage._M_t.
          super___uniq_ptr_impl<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter>
          ._M_t.
          super__Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
          .super__Head_base<0UL,_std::__future_base::_Result<void>_*,_false>._M_head_impl._7_1_ =
               false;
          client2Debugger.
          super___shared_ptr<cmDebugger::cmDebuggerPipeClient_POSIX,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._4_4_ = 1;
        }
      }
      dap::ResponseOrError<dap::CMakeInitializeResponse>::~ResponseOrError
                ((ResponseOrError<dap::CMakeInitializeResponse> *)&launchRequest.noDebug);
      dap::future<dap::ResponseOrError<dap::CMakeInitializeResponse>_>::~future
                ((future<dap::ResponseOrError<dap::CMakeInitializeResponse>_> *)
                 ((long)&initializeResponse.error.message.field_2 + 8));
      dap::CMakeInitializeRequest::~CMakeInitializeRequest
                ((CMakeInitializeRequest *)
                 &response.state.
                  super___shared_ptr<dap::detail::promise_state<dap::ResponseOrError<dap::CMakeInitializeResponse>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::shared_ptr<cmDebugger::cmDebuggerPipeClient_POSIX>::~shared_ptr
                ((shared_ptr<cmDebugger::cmDebuggerPipeClient_POSIX> *)local_220);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(startedListeningFuture.wait_for(futureTimeout) == std::future_status::ready) failed on line "
                              );
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x81);
      std::operator<<(poVar4,"\n");
      debuggerConnectionCreatedPromise._M_storage._M_t.
      super___uniq_ptr_impl<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter>
      ._M_t.
      super__Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
      .super__Head_base<0UL,_std::__future_base::_Result<void>_*,_false>._M_head_impl._7_1_ = false;
      client2Debugger.
      super___shared_ptr<cmDebugger::cmDebuggerPipeClient_POSIX,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._4_4_ = 1;
    }
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "ASSERT_TRUE(debuggerConnectionCreatedFuture.wait_for(futureTimeout) == std::future_status::ready) failed on line "
                            );
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x7f);
    std::operator<<(poVar4,"\n");
    debuggerConnectionCreatedPromise._M_storage._M_t.
    super___uniq_ptr_impl<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
    .super__Head_base<0UL,_std::__future_base::_Result<void>_*,_false>._M_head_impl._7_1_ = false;
    client2Debugger.
    super___shared_ptr<cmDebugger::cmDebuggerPipeClient_POSIX,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._4_4_ = 1;
  }
  ScopedThread::~ScopedThread(&local_1d8);
  std::unique_ptr<dap::Session,_std::default_delete<dap::Session>_>::~unique_ptr(&local_1a8);
  std::__cxx11::string::~string((string *)local_198);
  std::future<bool>::~future((future<bool> *)&futureTimeout);
  std::promise<bool>::~promise
            ((promise<bool> *)
             &disconnectResponseReceivedFuture.super___basic_future<bool>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::future<bool>::~future((future<bool> *)&disconnectResponseReceivedPromise._M_storage);
  std::promise<bool>::~promise
            ((promise<bool> *)
             &threadExitedFuture.super___basic_future<bool>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::future<bool>::~future((future<bool> *)&threadExitedPromise._M_storage);
  std::promise<bool>::~promise
            ((promise<bool> *)
             &threadStartedFuture.super___basic_future<bool>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::future<bool>::~future((future<bool> *)&threadStartedPromise._M_storage);
  std::promise<bool>::~promise
            ((promise<bool> *)
             &terminatedEventReceivedFuture.super___basic_future<bool>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::future<bool>::~future((future<bool> *)&terminatedEventReceivedPromise._M_storage);
  std::promise<bool>::~promise
            ((promise<bool> *)
             &exitedEventReceivedFuture.super___basic_future<bool>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::future<bool>::~future((future<bool> *)&exitedEventReceivedPromise._M_storage);
  std::promise<bool>::~promise
            ((promise<bool> *)
             &initializedEventReceivedFuture.super___basic_future<bool>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::future<bool>::~future((future<bool> *)&initializedEventReceivedPromise._M_storage);
  std::promise<bool>::~promise
            ((promise<bool> *)
             &debuggerAdapterInitializedFuture.super___basic_future<bool>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::future<void>::~future((future<void> *)&debuggerAdapterInitializedPromise._M_storage);
  std::future<void>::~future((future<void> *)&stack0xffffffffffffffc8);
  std::promise<void>::~promise
            ((promise<void> *)
             &debuggerConnectionCreatedFuture.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return debuggerConnectionCreatedPromise._M_storage._M_t.
         super___uniq_ptr_impl<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter>
         ._M_t.
         super__Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
         .super__Head_base<0UL,_std::__future_base::_Result<void>_*,_false>._M_head_impl._7_1_;
}

Assistant:

bool testProtocolWithPipes()
{
  std::promise<void> debuggerConnectionCreatedPromise;
  std::future<void> debuggerConnectionCreatedFuture =
    debuggerConnectionCreatedPromise.get_future();

  std::future<void> startedListeningFuture;

  std::promise<bool> debuggerAdapterInitializedPromise;
  std::future<bool> debuggerAdapterInitializedFuture =
    debuggerAdapterInitializedPromise.get_future();

  std::promise<bool> initializedEventReceivedPromise;
  std::future<bool> initializedEventReceivedFuture =
    initializedEventReceivedPromise.get_future();

  std::promise<bool> exitedEventReceivedPromise;
  std::future<bool> exitedEventReceivedFuture =
    exitedEventReceivedPromise.get_future();

  std::promise<bool> terminatedEventReceivedPromise;
  std::future<bool> terminatedEventReceivedFuture =
    terminatedEventReceivedPromise.get_future();

  std::promise<bool> threadStartedPromise;
  std::future<bool> threadStartedFuture = threadStartedPromise.get_future();

  std::promise<bool> threadExitedPromise;
  std::future<bool> threadExitedFuture = threadExitedPromise.get_future();

  std::promise<bool> disconnectResponseReceivedPromise;
  std::future<bool> disconnectResponseReceivedFuture =
    disconnectResponseReceivedPromise.get_future();

  auto futureTimeout = std::chrono::seconds(60);

#ifdef _WIN32
  std::string namedPipe = R"(\\.\pipe\LOCAL\CMakeDebuggerPipe2_)" +
    cmCryptoHash(cmCryptoHash::AlgoSHA256)
      .HashString(cmSystemTools::GetCurrentWorkingDirectory());
#else
  std::string namedPipe = "CMakeDebuggerPipe2";
#endif

  std::unique_ptr<dap::Session> client = dap::Session::create();
  client->registerHandler([&](const dap::InitializedEvent& e) {
    (void)e;
    initializedEventReceivedPromise.set_value(true);
  });
  client->registerHandler([&](const dap::ExitedEvent& e) {
    (void)e;
    exitedEventReceivedPromise.set_value(true);
  });
  client->registerHandler([&](const dap::TerminatedEvent& e) {
    (void)e;
    terminatedEventReceivedPromise.set_value(true);
  });
  client->registerHandler([&](const dap::ThreadEvent& e) {
    if (e.reason == "started") {
      threadStartedPromise.set_value(true);
    } else if (e.reason == "exited") {
      threadExitedPromise.set_value(true);
    }
  });

  ScopedThread debuggerThread([&]() -> int {
    try {
      auto connection =
        std::make_shared<cmDebugger::cmDebuggerPipeConnection>(namedPipe);
      startedListeningFuture = connection->StartedListening.get_future();
      debuggerConnectionCreatedPromise.set_value();
      std::shared_ptr<cmDebugger::cmDebuggerAdapter> debuggerAdapter =
        std::make_shared<cmDebugger::cmDebuggerAdapter>(
          connection, dap::file(stdout, false));

      debuggerAdapterInitializedPromise.set_value(true);
      debuggerAdapter->ReportExitCode(0);

      // Ensure the disconnectResponse has been received before
      // destructing debuggerAdapter.
      ASSERT_TRUE(disconnectResponseReceivedFuture.wait_for(futureTimeout) ==
                  std::future_status::ready);
      return 0;
    } catch (const std::runtime_error& error) {
      std::cerr << "Error: Failed to create debugger adapter.\n";
      std::cerr << error.what() << "\n";
      return -1;
    }
  });

  ASSERT_TRUE(debuggerConnectionCreatedFuture.wait_for(futureTimeout) ==
              std::future_status::ready);
  ASSERT_TRUE(startedListeningFuture.wait_for(futureTimeout) ==
              std::future_status::ready);

  auto client2Debugger =
    std::make_shared<cmDebugger::cmDebuggerPipeClient>(namedPipe);

  client2Debugger->WaitForConnection();
  client->bind(client2Debugger, client2Debugger);

  dap::CMakeInitializeRequest initializeRequest;
  auto response = client->send(initializeRequest);
  auto initializeResponse = response.get();
  ASSERT_TRUE(!initializeResponse.error);
  ASSERT_TRUE(initializeResponse.response.cmakeVersion.full == CMake_VERSION);
  ASSERT_TRUE(initializeResponse.response.cmakeVersion.major ==
              CMake_VERSION_MAJOR);
  ASSERT_TRUE(initializeResponse.response.cmakeVersion.minor ==
              CMake_VERSION_MINOR);
  ASSERT_TRUE(initializeResponse.response.cmakeVersion.patch ==
              CMake_VERSION_PATCH);
  ASSERT_TRUE(initializeResponse.response.supportsExceptionInfoRequest);
  ASSERT_TRUE(
    initializeResponse.response.exceptionBreakpointFilters.has_value());
  dap::LaunchRequest launchRequest;
  auto launchResponse = client->send(launchRequest).get();
  ASSERT_TRUE(!launchResponse.error);

  dap::ConfigurationDoneRequest configurationDoneRequest;
  auto configurationDoneResponse =
    client->send(configurationDoneRequest).get();
  ASSERT_TRUE(!configurationDoneResponse.error);

  ASSERT_TRUE(debuggerAdapterInitializedFuture.wait_for(futureTimeout) ==
              std::future_status::ready);
  ASSERT_TRUE(initializedEventReceivedFuture.wait_for(futureTimeout) ==
              std::future_status::ready);
  ASSERT_TRUE(terminatedEventReceivedFuture.wait_for(futureTimeout) ==
              std::future_status::ready);
  ASSERT_TRUE(threadStartedFuture.wait_for(futureTimeout) ==
              std::future_status::ready);
  ASSERT_TRUE(threadExitedFuture.wait_for(futureTimeout) ==
              std::future_status::ready);
  ASSERT_TRUE(exitedEventReceivedFuture.wait_for(futureTimeout) ==
              std::future_status::ready);

  dap::DisconnectRequest disconnectRequest;
  auto disconnectResponse = client->send(disconnectRequest).get();
  disconnectResponseReceivedPromise.set_value(true);
  ASSERT_TRUE(!disconnectResponse.error);

  return true;
}